

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O3

void __thiscall Fl_RGB_Image::color_average(Fl_RGB_Image *this,Fl_Color c,float i)

{
  byte *pbVar1;
  undefined4 in_EAX;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  uchar *puVar5;
  byte *pbVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  float fVar11;
  uchar b;
  uchar g;
  uchar r;
  undefined4 uStack_28;
  float local_24;
  
  if (((((this->super_Fl_Image).w_ != 0) && ((this->super_Fl_Image).h_ != 0)) &&
      ((this->super_Fl_Image).d_ != 0)) && (this->array != (uchar *)0x0)) {
    _uStack_28 = CONCAT44(i,in_EAX);
    (*(this->super_Fl_Image)._vptr_Fl_Image[8])(this);
    if (this->alloc_array == 0) {
      puVar3 = (uchar *)operator_new__((long)(this->super_Fl_Image).d_ *
                                       (long)(this->super_Fl_Image).w_ *
                                       (long)(this->super_Fl_Image).h_);
    }
    else {
      puVar3 = this->array;
    }
    Fl::get_color(c,(uchar *)((long)&uStack_28 + 3),(uchar *)((long)&uStack_28 + 2),
                  (uchar *)((long)&uStack_28 + 1));
    fVar11 = 0.0;
    if ((0.0 <= local_24) && (fVar11 = local_24, 1.0 < local_24)) {
      fVar11 = 1.0;
    }
    iVar2 = (this->super_Fl_Image).ld_;
    if (iVar2 == 0) {
      iVar9 = (this->super_Fl_Image).d_;
      lVar10 = 0;
    }
    else {
      iVar9 = (this->super_Fl_Image).d_;
      lVar10 = (long)(iVar2 - (this->super_Fl_Image).w_ * iVar9);
    }
    iVar2 = (int)(long)(fVar11 * 256.0);
    iVar4 = 0x100 - iVar2;
    if (iVar9 < 3) {
      iVar9 = (this->super_Fl_Image).h_;
      if (0 < iVar9) {
        pbVar6 = this->array;
        iVar8 = (this->super_Fl_Image).w_;
        iVar7 = 0;
        puVar5 = puVar3;
        do {
          if (0 < iVar8) {
            iVar9 = 0;
            do {
              *puVar5 = (uchar)((uint)*pbVar6 * iVar2 +
                                iVar4 * (((uint)uStack_28._2_1_ * 0x3d +
                                          (uint)uStack_28._3_1_ * 0x1f + (uint)uStack_28._1_1_ * 8)
                                        / 100) >> 8);
              if ((this->super_Fl_Image).d_ < 2) {
                pbVar6 = pbVar6 + 1;
                puVar5 = puVar5 + 1;
              }
              else {
                pbVar1 = pbVar6 + 1;
                pbVar6 = pbVar6 + 2;
                puVar5[1] = *pbVar1;
                puVar5 = puVar5 + 2;
              }
              iVar9 = iVar9 + 1;
              iVar8 = (this->super_Fl_Image).w_;
            } while (iVar9 < iVar8);
            iVar9 = (this->super_Fl_Image).h_;
          }
          iVar7 = iVar7 + 1;
          pbVar6 = pbVar6 + lVar10;
        } while (iVar7 < iVar9);
      }
    }
    else {
      iVar9 = (this->super_Fl_Image).h_;
      if (0 < iVar9) {
        pbVar6 = this->array;
        iVar8 = (this->super_Fl_Image).w_;
        iVar7 = 0;
        puVar5 = puVar3;
        do {
          if (0 < iVar8) {
            iVar9 = 0;
            do {
              *puVar5 = (uchar)((uint)*pbVar6 * iVar2 + (uint)uStack_28._3_1_ * iVar4 >> 8);
              puVar5[1] = (uchar)((uint)pbVar6[1] * iVar2 + (uint)uStack_28._2_1_ * iVar4 >> 8);
              puVar5[2] = (uchar)((uint)pbVar6[2] * iVar2 + (uint)uStack_28._1_1_ * iVar4 >> 8);
              if ((this->super_Fl_Image).d_ < 4) {
                pbVar6 = pbVar6 + 3;
                puVar5 = puVar5 + 3;
              }
              else {
                pbVar1 = pbVar6 + 3;
                pbVar6 = pbVar6 + 4;
                puVar5[3] = *pbVar1;
                puVar5 = puVar5 + 4;
              }
              iVar9 = iVar9 + 1;
              iVar8 = (this->super_Fl_Image).w_;
            } while (iVar9 < iVar8);
            iVar9 = (this->super_Fl_Image).h_;
          }
          iVar7 = iVar7 + 1;
          pbVar6 = pbVar6 + lVar10;
        } while (iVar7 < iVar9);
      }
    }
    if (this->alloc_array == 0) {
      this->array = puVar3;
      this->alloc_array = 1;
      (this->super_Fl_Image).ld_ = 0;
    }
  }
  return;
}

Assistant:

void Fl_RGB_Image::color_average(Fl_Color c, float i) {
  // Don't average an empty image...
  if (!w() || !h() || !d() || !array) return;

  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  uchar		*new_array,
		*new_ptr;

  if (!alloc_array) new_array = new uchar[h() * w() * d()];
  else new_array = (uchar *)array;

  // Get the color to blend with...
  uchar		r, g, b;
  unsigned	ia, ir, ig, ib;

  Fl::get_color(c, r, g, b);
  if (i < 0.0f) i = 0.0f;
  else if (i > 1.0f) i = 1.0f;

  ia = (unsigned)(256 * i);
  ir = r * (256 - ia);
  ig = g * (256 - ia);
  ib = b * (256 - ia);

  // Update the image data to do the blend...
  const uchar	*old_ptr;
  int		x, y;
  int   line_i = ld() ? ld() - (w()*d()) : 0; // increment from line end to beginning of next line

  if (d() < 3) {
    ig = (r * 31 + g * 61 + b * 8) / 100 * (256 - ia);

    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	if (d() > 1) *new_ptr++ = *old_ptr++;
      }
  } else {
    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ir) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ib) >> 8;
	if (d() > 3) *new_ptr++ = *old_ptr++;
      }
  }

  // Set the new pointers/values as needed...
  if (!alloc_array) {
    array       = new_array;
    alloc_array = 1;

    ld(0);
  }
}